

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O2

bool __thiscall
binlog::SessionWriter::
addEvent<int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,int **args,
          unique_ptr<int,_std::default_delete<int>_> *args_1,shared_ptr<int> *args_2)

{
  size_t size;
  QueueWriter *this_00;
  char **ppcVar1;
  int *piVar2;
  char *pcVar3;
  Queue *pQVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long local_58 [2];
  uint local_48;
  undefined4 uStack_44;
  uint uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_58[0] = 8;
  local_58[1] = 8;
  piVar2 = (args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  uVar8 = -(uint)((int)*args == 0 && (int)((ulong)*args >> 0x20) == 0);
  uVar9 = -(uint)((int)piVar2 == 0 && (int)((ulong)piVar2 >> 0x20) == 0);
  local_48 = uVar8 & 1 | ~uVar8 & 5;
  uStack_44 = 0;
  uStack_40 = uVar9 & 1 | ~uVar9 & 5;
  uStack_3c = 0;
  local_38 = (ulong)((args_2->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
                    (element_type *)0x0) * 4 + 1;
  lVar7 = 0;
  for (lVar6 = 0; lVar6 != 0x28; lVar6 = lVar6 + 8) {
    lVar7 = lVar7 + *(long *)((long)local_58 + lVar6);
  }
  size = lVar7 + 4;
  this_00 = &this->_qw;
  bVar5 = detail::QueueWriter::beginWrite(this_00,size);
  if (!bVar5) {
    replaceChannel(this,size);
    bVar5 = detail::QueueWriter::beginWrite(this_00,size);
    if (!bVar5) {
      return false;
    }
  }
  *(int *)(this->_qw)._writePos = (int)lVar7;
  pcVar3 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar3 + 4;
  *(uint64_t *)(pcVar3 + 4) = eventSourceId;
  pcVar3 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar3 + 8;
  *(uint64_t *)(pcVar3 + 8) = clock;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 8;
  mserialize::detail::BuiltinSerializer<int_*,_void>::serialize<binlog::detail::QueueWriter>
            (args,this_00);
  mserialize::detail::BuiltinSerializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
  serialize<binlog::detail::QueueWriter>(args_1,this_00);
  mserialize::detail::BuiltinSerializer<std::shared_ptr<int>,_void>::
  serialize<binlog::detail::QueueWriter>(args_2,this_00);
  pQVar4 = (this->_qw)._queue;
  (pQVar4->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar4->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}